

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O1

int main(int argc,char **argv)

{
  testDesc *ptVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  char *pcVar8;
  char *pcVar9;
  char *__file;
  undefined1 *puVar10;
  long lVar11;
  char *__format;
  testDesc *ptVar12;
  ulong uVar13;
  bool bVar14;
  glob64_t gStack_140;
  stat64 sStack_f8;
  char **ppcStack_68;
  
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlInitializeCatalog();
  xmlCatalogSetDefaults(0);
  iVar5 = 0x10288f;
  iVar4 = xmlRegisterInputCallbacks(hugeMatch,hugeOpen,hugeRead,hugeClose);
  if (iVar4 < 0) {
    main_cold_1();
    iVar3 = nb_tests;
    iVar2 = nb_leaks;
    iVar4 = nb_errors;
    ppcStack_68 = argv;
    if ((tests_quiet == '\0') && (testDescriptions[iVar5].desc != (char *)0x0)) {
      printf("## %s\n");
    }
    if (testDescriptions[iVar5].in == (char *)0x0) {
      iVar5 = (*testDescriptions[iVar5].func)
                        ((char *)0x0,(char *)0x0,(char *)0x0,testDescriptions[iVar5].options);
      if (iVar5 != 0) {
        nb_errors = nb_errors + 1;
      }
    }
    else {
      gStack_140.gl_offs = 0;
      glob64(testDescriptions[iVar5].in,8,(__errfunc *)0x0,&gStack_140);
      if (gStack_140.gl_pathc != 0) {
        uVar13 = 0;
        do {
          iVar6 = stat64(gStack_140.gl_pathv[uVar13],&sStack_f8);
          if ((iVar6 != -1) && ((sStack_f8.st_mode & 0xf000) == 0x8000)) {
            if (testDescriptions[iVar5].suffix == (char *)0x0) {
              pcVar9 = (char *)0x0;
            }
            else {
              pcVar8 = gStack_140.gl_pathv[uVar13];
              pcVar9 = resultFilename(pcVar8,testDescriptions[iVar5].out,
                                      testDescriptions[iVar5].suffix);
              if (pcVar9 == (char *)0x0) {
                runtest_cold_1();
                goto LAB_0010288a;
              }
            }
            if (testDescriptions[iVar5].err == (char *)0x0) {
              __file = (char *)0x0;
            }
            else {
              pcVar8 = gStack_140.gl_pathv[uVar13];
              __file = resultFilename(pcVar8,testDescriptions[iVar5].out,testDescriptions[iVar5].err
                                     );
              if (__file == (char *)0x0) {
LAB_0010288a:
                runtest_cold_2();
                if (pcVar8 == (char *)0x0) {
                  return 0;
                }
                pcVar9 = "test/recurse/huge.xml";
                lVar11 = 0;
                do {
                  iVar4 = strcmp(pcVar8,pcVar9);
                  if (iVar4 == 0) {
                    return 1;
                  }
                  pcVar9 = *(char **)((long)&hugeDocTable[1].URL + lVar11);
                  lVar11 = lVar11 + 0x20;
                } while (lVar11 != 0x40);
                return 0;
              }
            }
            if ((pcVar9 == (char *)0x0) ||
               ((iVar6 = stat64(pcVar9,&sStack_f8), iVar6 != -1 &&
                ((sStack_f8.st_mode & 0xf000) == 0x8000)))) {
              if ((__file != (char *)0x0) &&
                 ((iVar6 = stat64(__file,&sStack_f8), iVar6 == -1 ||
                  ((sStack_f8.st_mode & 0xf000) != 0x8000)))) {
                __format = "Missing error file %s\n";
                pcVar8 = __file;
                goto LAB_001027e8;
              }
              iVar6 = xmlMemUsed();
              iVar7 = (*testDescriptions[iVar5].func)
                                (gStack_140.gl_pathv[uVar13],pcVar9,__file,
                                 testDescriptions[iVar5].options | 0x10000);
              xmlResetLastError();
              if (iVar7 == 0) {
                iVar7 = xmlMemUsed();
                __stream = _stderr;
                if (iVar7 != iVar6) {
                  pcVar8 = gStack_140.gl_pathv[uVar13];
                  iVar7 = xmlMemUsed();
                  fprintf(__stream,"File %s leaked %d bytes\n",pcVar8,(ulong)(uint)(iVar7 - iVar6));
                  nb_leaks = nb_leaks + 1;
                }
              }
              else {
                fprintf(_stderr,"File %s generated an error\n",gStack_140.gl_pathv[uVar13]);
                nb_errors = nb_errors + 1;
              }
            }
            else {
              __format = "Missing result file %s\n";
              pcVar8 = pcVar9;
LAB_001027e8:
              fprintf(_stderr,__format,pcVar8);
            }
            if (pcVar9 != (char *)0x0) {
              free(pcVar9);
            }
            if (__file != (char *)0x0) {
              free(__file);
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < gStack_140.gl_pathc);
      }
      globfree64(&gStack_140);
      iVar5 = extraout_EAX;
    }
    if (verbose == '\x01') {
      if (nb_leaks == iVar2 && nb_errors == iVar4) {
        iVar5 = printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar3));
      }
      else {
        iVar5 = printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar3),
                       (ulong)(uint)(nb_errors - iVar4),(ulong)(uint)(nb_leaks - iVar2));
      }
    }
    return iVar5;
  }
  if (1 < argc) {
    iVar4 = 0;
    uVar13 = 1;
    do {
      pcVar8 = argv[uVar13];
      iVar5 = strcmp(pcVar8,"-v");
      puVar10 = &verbose;
      if (iVar5 == 0) {
LAB_001024ca:
        *puVar10 = 1;
      }
      else {
        iVar5 = strcmp(pcVar8,"-quiet");
        puVar10 = &tests_quiet;
        if (iVar5 == 0) goto LAB_001024ca;
        iVar5 = 0;
        ptVar12 = testDescriptions;
        do {
          pcVar8 = strstr(ptVar12->desc,argv[uVar13]);
          if (pcVar8 != (char *)0x0) {
            runtest(iVar5);
            iVar4 = iVar4 + 1;
          }
          iVar5 = iVar5 + 1;
          ptVar1 = ptVar12 + 1;
          ptVar12 = ptVar12 + 1;
        } while (ptVar1->func != (functest)0x0);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)argc);
    if (iVar4 != 0) goto LAB_001024ec;
  }
  lVar11 = 0;
  do {
    runtest((int)lVar11);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0xb);
LAB_001024ec:
  bVar14 = nb_errors != 0 || nb_leaks != 0;
  if (bVar14) {
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests);
  }
  else {
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  xmlCleanupParser();
  return (uint)bVar14;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
	else {
	    for (i = 0; testDescriptions[i].func != NULL; i++) {
	        if (strstr(testDescriptions[i].desc, argv[a])) {
		    ret += runtest(i);
		    subset++;
		}
	    }
	}
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();

    return(ret);
}